

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O0

MethodText * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeMethodText
          (MethodText *__return_storage_ptr__,CapnpcCppMain *this,StringPtr interfaceName,
          Method method,TemplateContext *templateContext)

{
  Reader proto_00;
  ArrayDisposer *schema;
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  Schema SVar4;
  uint64_t uVar5;
  StringTree *pSVar6;
  Array<capnp::(anonymous_namespace)::CppTypeName> *pAVar7;
  CppTypeName *params;
  CppTypeName *params_00;
  TemplateContext *params_2;
  StringPtr name_00;
  Iterator IVar8;
  Reader RVar9;
  char (*params_4) [10];
  ArrayPtr<const_char> *params_8;
  char *params_11;
  bool *params_12;
  char (*params_16) [12];
  char (*in_stack_fffffffffffff408) [16];
  ArrayPtr<const_char> local_ad8;
  StringTree local_ac8;
  StringTree local_a90;
  StringTree local_a58;
  StringTree local_a20;
  char *local_9e8;
  undefined1 local_9e0 [8];
  char *local_9d8;
  ArrayDisposer *local_9d0;
  undefined1 local_9c8 [8];
  StringTree local_9c0;
  undefined1 local_988 [8];
  StringTree requestMethodImpl;
  undefined1 local_948 [6];
  uint16_t methodId;
  CappedArray<char,_17UL> interfaceIdHex;
  uint64_t interfaceId;
  undefined1 local_918 [8];
  Reader interfaceProto;
  String shortResultType;
  String shortParamType;
  CppTypeName local_868;
  Maybe<capnp::InterfaceSchema::Method> local_828;
  Schema local_7e0;
  CppTypeName local_7d8;
  ArrayPtr<capnp::(anonymous_namespace)::CppTypeName> local_798;
  Array<capnp::(anonymous_namespace)::CppTypeName> local_788;
  String local_770;
  ArrayPtr<const_char> local_758;
  Array<capnp::(anonymous_namespace)::CppTypeName> local_748;
  String local_730;
  ArrayPtr<const_char> local_718;
  String local_708;
  ArrayPtr<const_char> local_6f0;
  undefined1 local_6e0 [8];
  CppTypeName genericResultType;
  CppTypeName resultType;
  CppTypeName local_610;
  Maybe<capnp::InterfaceSchema::Method> local_5d0;
  Schema local_588;
  CppTypeName local_580;
  ArrayPtr<capnp::(anonymous_namespace)::CppTypeName> local_540;
  Array<capnp::(anonymous_namespace)::CppTypeName> local_530;
  String local_518;
  ArrayPtr<const_char> local_500;
  Array<capnp::(anonymous_namespace)::CppTypeName> local_4f0;
  String local_4d8;
  ArrayPtr<const_char> local_4c0;
  String local_4b0;
  ArrayPtr<const_char> local_498;
  undefined1 local_488 [8];
  CppTypeName genericParamType;
  CppTypeName paramType;
  undefined1 local_3b0 [8];
  CppTypeName interfaceTypeName;
  anon_class_1_0_00000001 local_359;
  Mapper<kj::Array<capnp::(anonymous_namespace)::CppTypeName>_&> local_358;
  Array<kj::StringTree> local_350;
  StringTree local_338;
  String local_300;
  String implicitParamsTemplateDecl;
  Array<capnp::(anonymous_namespace)::CppTypeName> implicitParams;
  CppTypeName local_290;
  undefined1 local_250 [8];
  Reader param;
  undefined1 local_210 [8];
  Iterator __end2;
  undefined1 local_1f0 [8];
  Iterator __begin2;
  Reader *__range2;
  ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName> implicitParamsBuilder;
  Reader implicitParamsReader;
  Reader resultProto;
  Reader paramProto;
  undefined1 local_110 [8];
  String identifierName;
  StructSchema resultSchema;
  Schema local_e0;
  StructSchema paramSchema;
  undefined1 local_c0 [8];
  String titleCase;
  undefined1 auStack_70 [8];
  StringPtr name;
  Reader proto;
  TemplateContext *templateContext_local;
  CapnpcCppMain *this_local;
  StringPtr interfaceName_local;
  
  interfaceName_local.content.ptr = (char *)interfaceName.content.size_;
  this_local = (CapnpcCppMain *)interfaceName.content.ptr;
  params_2 = templateContext;
  interfaceName_local.content.size_ = (size_t)__return_storage_ptr__;
  InterfaceSchema::Method::getProto((Reader *)&name.content.size_,&method);
  titleCase.content.disposer = (ArrayDisposer *)name.content.size_;
  proto_00._reader.capTable = (CapTableReader *)proto._reader.segment;
  proto_00._reader.segment = (SegmentReader *)name.content.size_;
  proto_00._reader.data = proto._reader.capTable;
  proto_00._reader.pointers = (WirePointer *)proto._reader.data;
  proto_00._reader._32_8_ = proto._reader.pointers;
  proto_00._reader._40_8_ = proto._reader._32_8_;
  _auStack_70 = (ArrayPtr<const_char>)protoName<capnp::schema::Method::Reader>(this,proto_00);
  paramSchema.super_Schema.raw = (Schema)(Schema)auStack_70;
  toTitleCase((String *)local_c0,this,(StringPtr)_auStack_70);
  local_e0.raw = (RawBrandedSchema *)InterfaceSchema::Method::getParamType(&method);
  identifierName.content.disposer = (ArrayDisposer *)InterfaceSchema::Method::getResultType(&method)
  ;
  safeIdentifier((String *)local_110,(StringPtr)_auStack_70);
  Schema::getProto((Reader *)&resultProto._reader.nestingLimit,&local_e0);
  Schema::getProto((Reader *)&implicitParamsReader.reader.nestingLimit,
                   (Schema *)&identifierName.content.disposer);
  capnp::schema::Method::Reader::getImplicitParameters
            ((Reader *)&implicitParamsBuilder.disposer,(Reader *)&name.content.size_);
  uVar2 = List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader::size
                    ((Reader *)&implicitParamsBuilder.disposer);
  kj::heapArrayBuilder<capnp::(anonymous_namespace)::CppTypeName>
            ((ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName> *)&__range2,(ulong)uVar2);
  __begin2._8_8_ = &implicitParamsBuilder.disposer;
  IVar8 = List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader::begin
                    ((Reader *)__begin2._8_8_);
  __end2._8_8_ = IVar8.container;
  __begin2.container._0_4_ = IVar8.index;
  local_1f0 = (undefined1  [8])__end2._8_8_;
  IVar8 = List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader::end
                    ((Reader *)__begin2._8_8_);
  param._reader._40_8_ = IVar8.container;
  __end2.container._0_4_ = IVar8.index;
  local_210 = (undefined1  [8])param._reader._40_8_;
  while (bVar1 = _::
                 IndexingIterator<const_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_capnp::schema::Node::Parameter::Reader>
                 ::operator!=((IndexingIterator<const_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_capnp::schema::Node::Parameter::Reader>
                               *)local_1f0,
                              (IndexingIterator<const_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_capnp::schema::Node::Parameter::Reader>
                               *)local_210), bVar1) {
    _::
    IndexingIterator<const_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_capnp::schema::Node::Parameter::Reader>
    ::operator*((Reader *)local_250,
                (IndexingIterator<const_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_capnp::schema::Node::Parameter::Reader>
                 *)local_1f0);
    RVar9 = capnp::schema::Node::Parameter::Reader::getName((Reader *)local_250);
    name_00.content.ptr = RVar9.super_StringPtr.content.size_;
    name_00.content.size_ = (size_t)RVar9.super_StringPtr.content.ptr;
    CppTypeName::makeTemplateParam(&local_290,RVar9.super_StringPtr.content.ptr,name_00);
    kj::ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName>::
    add<capnp::(anonymous_namespace)::CppTypeName>
              ((ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName> *)&__range2,&local_290);
    CppTypeName::~CppTypeName(&local_290);
    _::
    IndexingIterator<const_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_capnp::schema::Node::Parameter::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_capnp::schema::Node::Parameter::Reader>
                  *)local_1f0);
  }
  kj::ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName>::finish
            ((Array<capnp::(anonymous_namespace)::CppTypeName> *)
             &implicitParamsTemplateDecl.content.disposer,
             (ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName> *)&__range2);
  kj::String::String((String *)&stack0xfffffffffffffd18);
  sVar3 = kj::Array<capnp::(anonymous_namespace)::CppTypeName>::size
                    ((Array<capnp::(anonymous_namespace)::CppTypeName> *)
                     &implicitParamsTemplateDecl.content.disposer);
  if (sVar3 != 0) {
    kj::_::Mapper<kj::Array<capnp::(anonymous_namespace)::CppTypeName>_&>::Mapper
              (&local_358,
               (Array<capnp::(anonymous_namespace)::CppTypeName> *)
               &implicitParamsTemplateDecl.content.disposer);
    kj::_::Mapper<kj::Array<capnp::(anonymous_namespace)::CppTypeName>_&>::
    operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnpc_c___c__:2152:40)>
              (&local_350,&local_358,&local_359);
    kj::StringPtr::StringPtr((StringPtr *)&interfaceTypeName.isArgDependent,", ");
    kj::StringTree::StringTree(&local_338,&local_350,(StringPtr)stack0xfffffffffffffc90);
    kj::str<char_const(&)[11],kj::StringTree,char_const(&)[3]>
              (&local_300,(kj *)"template <",(char (*) [11])&local_338,(StringTree *)0x417ae1,
               (char (*) [3])params_2);
    kj::String::operator=((String *)&stack0xfffffffffffffd18,&local_300);
    kj::String::~String(&local_300);
    kj::StringTree::~StringTree(&local_338);
    kj::Array<kj::StringTree>::~Array(&local_350);
  }
  SVar4.raw = (RawBrandedSchema *)InterfaceSchema::Method::getContainingInterface(&method);
  kj::Maybe<capnp::InterfaceSchema::Method>::Maybe
            ((Maybe<capnp::InterfaceSchema::Method> *)&paramType.isArgDependent,(void *)0x0);
  pAVar7 = (Array<capnp::(anonymous_namespace)::CppTypeName> *)&paramType.isArgDependent;
  cppFullName((CppTypeName *)local_3b0,this,SVar4,(Maybe<capnp::InterfaceSchema::Method> *)pAVar7);
  kj::Maybe<capnp::InterfaceSchema::Method>::~Maybe
            ((Maybe<capnp::InterfaceSchema::Method> *)&paramType.isArgDependent);
  CppTypeName::CppTypeName((CppTypeName *)&genericParamType.isArgDependent);
  CppTypeName::CppTypeName((CppTypeName *)local_488);
  uVar5 = capnp::schema::Node::Reader::getScopeId((Reader *)&resultProto._reader.nestingLimit);
  if (uVar5 == 0) {
    CppTypeName::operator=((CppTypeName *)&genericParamType.isArgDependent,(CppTypeName *)local_3b0)
    ;
    sVar3 = kj::Array<capnp::(anonymous_namespace)::CppTypeName>::size
                      ((Array<capnp::(anonymous_namespace)::CppTypeName> *)
                       &implicitParamsTemplateDecl.content.disposer);
    if (sVar3 == 0) {
      kj::str<kj::String&,char_const(&)[7]>
                (&local_4b0,(kj *)local_c0,(String *)"Params",(char (*) [7])pAVar7);
      kj::StringPtr::StringPtr((StringPtr *)&local_498,&local_4b0);
      CppTypeName::addMemberType
                ((CppTypeName *)&genericParamType.isArgDependent,(StringPtr)local_498);
      kj::String::~String(&local_4b0);
      CppTypeName::operator=
                ((CppTypeName *)local_488,(CppTypeName *)&genericParamType.isArgDependent);
    }
    else {
      CppTypeName::operator=
                ((CppTypeName *)local_488,(CppTypeName *)&genericParamType.isArgDependent);
      kj::str<kj::String&,char_const(&)[7]>
                (&local_4d8,(kj *)local_c0,(String *)"Params",(char (*) [7])pAVar7);
      kj::StringPtr::StringPtr((StringPtr *)&local_4c0,&local_4d8);
      kj::Array<capnp::(anonymous_namespace)::CppTypeName>::Array(&local_4f0,(void *)0x0);
      pAVar7 = &local_4f0;
      CppTypeName::addMemberTemplate((CppTypeName *)local_488,(StringPtr)local_4c0,pAVar7);
      kj::Array<capnp::(anonymous_namespace)::CppTypeName>::~Array(&local_4f0);
      kj::String::~String(&local_4d8);
      kj::str<kj::String&,char_const(&)[7]>
                (&local_518,(kj *)local_c0,(String *)"Params",(char (*) [7])pAVar7);
      kj::StringPtr::StringPtr((StringPtr *)&local_500,&local_518);
      local_540 = kj::Array<capnp::(anonymous_namespace)::CppTypeName>::asPtr
                            ((Array<capnp::(anonymous_namespace)::CppTypeName> *)
                             &implicitParamsTemplateDecl.content.disposer);
      kj::heapArray<capnp::(anonymous_namespace)::CppTypeName>(&local_530,local_540);
      pAVar7 = &local_530;
      CppTypeName::addMemberTemplate
                ((CppTypeName *)&genericParamType.isArgDependent,(StringPtr)local_500,pAVar7);
      kj::Array<capnp::(anonymous_namespace)::CppTypeName>::~Array(&local_530);
      kj::String::~String(&local_518);
    }
  }
  else {
    local_588.raw = local_e0.raw;
    kj::Maybe<capnp::InterfaceSchema::Method>::Maybe(&local_5d0,&method);
    cppFullName(&local_580,this,local_588,&local_5d0);
    CppTypeName::operator=((CppTypeName *)&genericParamType.isArgDependent,&local_580);
    CppTypeName::~CppTypeName(&local_580);
    kj::Maybe<capnp::InterfaceSchema::Method>::~Maybe(&local_5d0);
    SVar4.raw = local_e0.raw;
    kj::Maybe<capnp::InterfaceSchema::Method>::Maybe
              ((Maybe<capnp::InterfaceSchema::Method> *)&resultType.isArgDependent,(void *)0x0);
    pAVar7 = (Array<capnp::(anonymous_namespace)::CppTypeName> *)&resultType.isArgDependent;
    cppFullName(&local_610,this,SVar4,(Maybe<capnp::InterfaceSchema::Method> *)pAVar7);
    CppTypeName::operator=((CppTypeName *)local_488,&local_610);
    CppTypeName::~CppTypeName(&local_610);
    kj::Maybe<capnp::InterfaceSchema::Method>::~Maybe
              ((Maybe<capnp::InterfaceSchema::Method> *)&resultType.isArgDependent);
  }
  CppTypeName::CppTypeName((CppTypeName *)&genericResultType.isArgDependent);
  CppTypeName::CppTypeName((CppTypeName *)local_6e0);
  uVar5 = capnp::schema::Node::Reader::getScopeId
                    ((Reader *)&implicitParamsReader.reader.nestingLimit);
  if (uVar5 == 0) {
    CppTypeName::operator=
              ((CppTypeName *)&genericResultType.isArgDependent,(CppTypeName *)local_3b0);
    sVar3 = kj::Array<capnp::(anonymous_namespace)::CppTypeName>::size
                      ((Array<capnp::(anonymous_namespace)::CppTypeName> *)
                       &implicitParamsTemplateDecl.content.disposer);
    if (sVar3 == 0) {
      kj::str<kj::String&,char_const(&)[8]>
                (&local_708,(kj *)local_c0,(String *)"Results",(char (*) [8])pAVar7);
      kj::StringPtr::StringPtr((StringPtr *)&local_6f0,&local_708);
      CppTypeName::addMemberType
                ((CppTypeName *)&genericResultType.isArgDependent,(StringPtr)local_6f0);
      kj::String::~String(&local_708);
      CppTypeName::operator=
                ((CppTypeName *)local_6e0,(CppTypeName *)&genericResultType.isArgDependent);
    }
    else {
      CppTypeName::operator=
                ((CppTypeName *)local_6e0,(CppTypeName *)&genericResultType.isArgDependent);
      kj::str<kj::String&,char_const(&)[8]>
                (&local_730,(kj *)local_c0,(String *)"Results",(char (*) [8])pAVar7);
      kj::StringPtr::StringPtr((StringPtr *)&local_718,&local_730);
      kj::Array<capnp::(anonymous_namespace)::CppTypeName>::Array(&local_748,(void *)0x0);
      pAVar7 = &local_748;
      CppTypeName::addMemberTemplate((CppTypeName *)local_6e0,(StringPtr)local_718,pAVar7);
      kj::Array<capnp::(anonymous_namespace)::CppTypeName>::~Array(&local_748);
      kj::String::~String(&local_730);
      kj::str<kj::String&,char_const(&)[8]>
                (&local_770,(kj *)local_c0,(String *)"Results",(char (*) [8])pAVar7);
      kj::StringPtr::StringPtr((StringPtr *)&local_758,&local_770);
      local_798 = kj::Array<capnp::(anonymous_namespace)::CppTypeName>::asPtr
                            ((Array<capnp::(anonymous_namespace)::CppTypeName> *)
                             &implicitParamsTemplateDecl.content.disposer);
      kj::heapArray<capnp::(anonymous_namespace)::CppTypeName>(&local_788,local_798);
      pAVar7 = &local_788;
      CppTypeName::addMemberTemplate
                ((CppTypeName *)&genericResultType.isArgDependent,(StringPtr)local_758,pAVar7);
      kj::Array<capnp::(anonymous_namespace)::CppTypeName>::~Array(&local_788);
      kj::String::~String(&local_770);
    }
  }
  else {
    local_7e0.raw = (RawBrandedSchema *)identifierName.content.disposer;
    kj::Maybe<capnp::InterfaceSchema::Method>::Maybe(&local_828,&method);
    cppFullName(&local_7d8,this,local_7e0,&local_828);
    CppTypeName::operator=((CppTypeName *)&genericResultType.isArgDependent,&local_7d8);
    CppTypeName::~CppTypeName(&local_7d8);
    kj::Maybe<capnp::InterfaceSchema::Method>::~Maybe(&local_828);
    schema = identifierName.content.disposer;
    kj::Maybe<capnp::InterfaceSchema::Method>::Maybe
              ((Maybe<capnp::InterfaceSchema::Method> *)&shortParamType.content.disposer,(void *)0x0
              );
    pAVar7 = (Array<capnp::(anonymous_namespace)::CppTypeName> *)&shortParamType.content.disposer;
    cppFullName(&local_868,this,(Schema)schema,(Maybe<capnp::InterfaceSchema::Method> *)pAVar7);
    CppTypeName::operator=((CppTypeName *)local_6e0,&local_868);
    CppTypeName::~CppTypeName(&local_868);
    kj::Maybe<capnp::InterfaceSchema::Method>::~Maybe
              ((Maybe<capnp::InterfaceSchema::Method> *)&shortParamType.content.disposer);
  }
  uVar5 = capnp::schema::Node::Reader::getScopeId((Reader *)&resultProto._reader.nestingLimit);
  if (uVar5 == 0) {
    kj::str<kj::String&,char_const(&)[7]>
              ((String *)&shortResultType.content.disposer,(kj *)local_c0,(String *)"Params",
               (char (*) [7])pAVar7);
  }
  else {
    kj::str<capnp::(anonymous_namespace)::CppTypeName&>
              ((String *)&shortResultType.content.disposer,(kj *)local_488,params);
  }
  uVar5 = capnp::schema::Node::Reader::getScopeId
                    ((Reader *)&implicitParamsReader.reader.nestingLimit);
  if (uVar5 == 0) {
    kj::str<kj::String&,char_const(&)[8]>
              ((String *)&interfaceProto._reader.nestingLimit,(kj *)local_c0,(String *)"Results",
               (char (*) [8])pAVar7);
  }
  else {
    kj::str<capnp::(anonymous_namespace)::CppTypeName&>
              ((String *)&interfaceProto._reader.nestingLimit,(kj *)local_6e0,params_00);
  }
  interfaceId = (uint64_t)InterfaceSchema::Method::getContainingInterface(&method);
  Schema::getProto((Reader *)local_918,(Schema *)&interfaceId);
  interfaceIdHex._24_8_ = capnp::schema::Node::Reader::getId((Reader *)local_918);
  kj::hex((CappedArray<char,_17UL> *)local_948,interfaceIdHex._24_8_);
  uVar2 = InterfaceSchema::Method::getIndex(&method);
  requestMethodImpl.branches.disposer._6_2_ = (undefined2)uVar2;
  TemplateContext::allDecls((StringTree *)(local_9c8 + 8),templateContext);
  bVar1 = TemplateContext::isGeneric(templateContext);
  local_9c8 = (undefined1  [8])0x418bbc;
  if (bVar1) {
    local_9c8 = (undefined1  [8])0x41b35c;
  }
  bVar1 = TemplateContext::isGeneric(templateContext);
  local_9d0 = (ArrayDisposer *)0x418bbb;
  if (bVar1) {
    local_9d0 = (ArrayDisposer *)0x4188b4;
  }
  params_16 = (char (*) [12])local_948;
  params_12 = &genericParamType.isArgDependent;
  params_11 = "Request(::kj::Maybe< ::capnp::MessageSize> sizeHint) {\n  return newCall<";
  kj::
  strTree<kj::StringTree,kj::String&,char_const*,char_const(&)[18],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[3],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[2],char_const*,kj::StringPtr&,char_const(&)[11],kj::StringPtr&,char_const(&)[73],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[3],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[12],kj::CappedArray<char,17ul>&,char_const(&)[6],unsigned_short&,char_const(&)[16]>
            ((StringTree *)local_988,(kj *)(local_9c8 + 8),(StringTree *)&stack0xfffffffffffffd18,
             (String *)local_9c8,(char **)"::capnp::Request<",(char (*) [18])params_12,
             (CppTypeName *)0x4197eb,(char (*) [3])&genericResultType.isArgDependent,
             (CppTypeName *)0x42473a,(char (*) [2])&local_9d0,(char **)&this_local,
             (StringPtr *)"::Client::",(char (*) [11])auStack_70,
             (StringPtr *)
             "Request(::kj::Maybe< ::capnp::MessageSize> sizeHint) {\n  return newCall<",
             (char (*) [73])params_12,(CppTypeName *)0x4197eb,
             (char (*) [3])&genericResultType.isArgDependent,(CppTypeName *)">(\n      0x",params_16
             ,(CappedArray<char,_17UL> *)"ull, ",
             (char (*) [6])((long)&requestMethodImpl.branches.disposer + 6),
             (unsigned_short *)", sizeHint);\n}\n",in_stack_fffffffffffff408);
  kj::StringTree::~StringTree((StringTree *)(local_9c8 + 8));
  sVar3 = kj::String::size((String *)&stack0xfffffffffffffd18);
  local_9d8 = "  ";
  if (sVar3 == 0) {
    local_9d8 = "";
  }
  bVar1 = TemplateContext::isGeneric(templateContext);
  local_9e0 = (undefined1  [8])0x417f08;
  if (bVar1) {
    local_9e0 = (undefined1  [8])0x41b35a;
  }
  bVar1 = TemplateContext::isGeneric(templateContext);
  local_9e8 = "";
  if (bVar1) {
    local_9e8 = ")";
  }
  params_4 = (char (*) [10])0x4197eb;
  kj::
  strTree<char_const*,kj::String&,char_const*,char_const(&)[18],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[3],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[2],char_const*,char_const(&)[2],kj::StringPtr&,char_const(&)[72]>
            (&__return_storage_ptr__->clientDecls,(kj *)&local_9d8,(char **)&stack0xfffffffffffffd18
             ,(String *)local_9e0,(char **)"::capnp::Request<",
             (char (*) [18])&genericParamType.isArgDependent,(CppTypeName *)0x4197eb,
             (char (*) [3])&genericResultType.isArgDependent,(CppTypeName *)0x42473a,
             (char (*) [2])&local_9e8,(char **)0x417f09,(char (*) [2])auStack_70,
             (StringPtr *)
             "Request(\n      ::kj::Maybe< ::capnp::MessageSize> sizeHint = nullptr);\n",
             (char (*) [72])params_11);
  uVar5 = capnp::schema::Node::Reader::getScopeId((Reader *)&resultProto._reader.nestingLimit);
  if (uVar5 == 0) {
    kj::
    strTree<char_const(&)[11],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[2],kj::String&,char_const(&)[9]>
              (&local_a20,(kj *)0x41a610,(char (*) [11])local_488,(CppTypeName *)0x417f09,
               (char (*) [2])local_c0,(String *)"Params;\n",(char (*) [9])params_4);
  }
  else {
    kj::strTree<>();
  }
  uVar5 = capnp::schema::Node::Reader::getScopeId
                    ((Reader *)&implicitParamsReader.reader.nestingLimit);
  if (uVar5 == 0) {
    kj::
    strTree<char_const(&)[11],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[2],kj::String&,char_const(&)[10]>
              (&local_a58,(kj *)0x41a610,(char (*) [11])local_6e0,(CppTypeName *)0x417f09,
               (char (*) [2])local_c0,(String *)"Results;\n",params_4);
  }
  else {
    kj::strTree<>();
  }
  kj::
  strTree<kj::StringTree,kj::StringTree,char_const(&)[32],kj::String&,char_const(&)[3],kj::String&,char_const(&)[3],kj::String&,char_const(&)[40],kj::String&,char_const(&)[2],kj::String&,char_const(&)[19]>
            (&__return_storage_ptr__->serverDecls,(kj *)&local_a20,&local_a58,
             (StringTree *)"  typedef ::capnp::CallContext<",
             (char (*) [32])&shortResultType.content.disposer,(String *)0x4197eb,
             (char (*) [3])&interfaceProto._reader.nestingLimit,(String *)0x419566,
             (char (*) [3])local_c0,(String *)"Context;\n  virtual ::kj::Promise<void> ",
             (char (*) [40])local_110,(String *)0x41b8b9,(char (*) [2])local_c0,
             (String *)"Context context);\n",(char (*) [19])params_12);
  sVar3 = kj::Array<capnp::(anonymous_namespace)::CppTypeName>::size
                    ((Array<capnp::(anonymous_namespace)::CppTypeName> *)
                     &implicitParamsTemplateDecl.content.disposer);
  if (sVar3 == 0) {
    kj::strTree<>();
  }
  else {
    pSVar6 = kj::mv<kj::StringTree>((StringTree *)local_988);
    kj::StringTree::StringTree(&__return_storage_ptr__->inlineDefs,pSVar6);
  }
  sVar3 = kj::Array<capnp::(anonymous_namespace)::CppTypeName>::size
                    ((Array<capnp::(anonymous_namespace)::CppTypeName> *)
                     &implicitParamsTemplateDecl.content.disposer);
  if (sVar3 == 0) {
    pSVar6 = kj::mv<kj::StringTree>((StringTree *)local_988);
    kj::StringTree::StringTree(&local_a90,pSVar6);
  }
  else {
    kj::strTree<>();
  }
  TemplateContext::allDecls(&local_ac8,templateContext);
  local_ad8 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName((Reader *)local_918)
  ;
  params_8 = &local_ad8;
  kj::
  strTree<kj::StringTree,kj::StringTree,char_const(&)[21],kj::StringPtr&,char_const(&)[11],kj::String&,char_const(&)[2],kj::String&,char_const(&)[80],capnp::Text::Reader,char_const(&)[5],kj::StringPtr&,char_const(&)[12],kj::CappedArray<char,17ul>&,char_const(&)[6],unsigned_short&,char_const(&)[6]>
            (&__return_storage_ptr__->sourceDefs,(kj *)&local_a90,&local_ac8,(StringTree *)0x41b3fe,
             (char (*) [21])&this_local,(StringPtr *)"::Server::",(char (*) [11])local_110,
             (String *)0x41b8b9,(char (*) [2])local_c0,
             (String *)
             "Context) {\n  return ::capnp::Capability::Server::internalUnimplemented(\n      \"",
             (char (*) [80])params_8,(Reader *)"\", \"",(char (*) [5])auStack_70,
             (StringPtr *)"\",\n      0x",(char (*) [12])local_948,
             (CappedArray<char,_17UL> *)"ull, ",
             (char (*) [6])((long)&requestMethodImpl.branches.disposer + 6),
             (unsigned_short *)0x418ebc,(char (*) [6])params_16);
  kj::
  strTree<char_const(&)[10],unsigned_short&,char_const(&)[16],kj::String&,char_const(&)[66],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[3],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[14]>
            (&__return_storage_ptr__->dispatchCase,(kj *)"    case ",
             (char (*) [10])((long)&requestMethodImpl.branches.disposer + 6),
             (unsigned_short *)0x41b71e,(char (*) [16])local_110,
             (String *)"(::capnp::Capability::Server::internalGetTypedContext<\n          ",
             (char (*) [66])local_488,(CppTypeName *)0x4197eb,(char (*) [3])local_6e0,
             (CppTypeName *)">(context));\n",(char (*) [14])params_8);
  kj::StringTree::~StringTree(&local_ac8);
  kj::StringTree::~StringTree(&local_a90);
  kj::StringTree::~StringTree(&local_a58);
  kj::StringTree::~StringTree(&local_a20);
  kj::StringTree::~StringTree((StringTree *)local_988);
  kj::String::~String((String *)&interfaceProto._reader.nestingLimit);
  kj::String::~String((String *)&shortResultType.content.disposer);
  CppTypeName::~CppTypeName((CppTypeName *)local_6e0);
  CppTypeName::~CppTypeName((CppTypeName *)&genericResultType.isArgDependent);
  CppTypeName::~CppTypeName((CppTypeName *)local_488);
  CppTypeName::~CppTypeName((CppTypeName *)&genericParamType.isArgDependent);
  CppTypeName::~CppTypeName((CppTypeName *)local_3b0);
  kj::String::~String((String *)&stack0xfffffffffffffd18);
  kj::Array<capnp::(anonymous_namespace)::CppTypeName>::~Array
            ((Array<capnp::(anonymous_namespace)::CppTypeName> *)
             &implicitParamsTemplateDecl.content.disposer);
  kj::ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName>::~ArrayBuilder
            ((ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName> *)&__range2);
  kj::String::~String((String *)local_110);
  kj::String::~String((String *)local_c0);
  return __return_storage_ptr__;
}

Assistant:

MethodText makeMethodText(kj::StringPtr interfaceName, InterfaceSchema::Method method,
                            const TemplateContext& templateContext) {
    auto proto = method.getProto();
    auto name = protoName(proto);
    auto titleCase = toTitleCase(name);
    auto paramSchema = method.getParamType();
    auto resultSchema = method.getResultType();
    auto identifierName = safeIdentifier(name);

    auto paramProto = paramSchema.getProto();
    auto resultProto = resultSchema.getProto();

    auto implicitParamsReader = proto.getImplicitParameters();
    auto implicitParamsBuilder = kj::heapArrayBuilder<CppTypeName>(implicitParamsReader.size());
    for (auto param: implicitParamsReader) {
      implicitParamsBuilder.add(CppTypeName::makeTemplateParam(param.getName()));
    }
    auto implicitParams = implicitParamsBuilder.finish();

    kj::String implicitParamsTemplateDecl;
    if (implicitParams.size() > 0) {
      implicitParamsTemplateDecl = kj::str(
          "template <", kj::StringTree(KJ_MAP(p, implicitParams) {
            return kj::strTree("typename ", p);
          }, ", "), ">\n");
    }


    CppTypeName interfaceTypeName = cppFullName(method.getContainingInterface(), nullptr);
    CppTypeName paramType;
    CppTypeName genericParamType;
    if (paramProto.getScopeId() == 0) {
      paramType = interfaceTypeName;
      if (implicitParams.size() == 0) {
        paramType.addMemberType(kj::str(titleCase, "Params"));
        genericParamType = paramType;
      } else {
        genericParamType = paramType;
        genericParamType.addMemberTemplate(kj::str(titleCase, "Params"), nullptr);
        paramType.addMemberTemplate(kj::str(titleCase, "Params"),
                                    kj::heapArray(implicitParams.asPtr()));
      }
    } else {
      paramType = cppFullName(paramSchema, method);
      genericParamType = cppFullName(paramSchema, nullptr);
    }
    CppTypeName resultType;
    CppTypeName genericResultType;
    if (resultProto.getScopeId() == 0) {
      resultType = interfaceTypeName;
      if (implicitParams.size() == 0) {
        resultType.addMemberType(kj::str(titleCase, "Results"));
        genericResultType = resultType;
      } else {
        genericResultType = resultType;
        genericResultType.addMemberTemplate(kj::str(titleCase, "Results"), nullptr);
        resultType.addMemberTemplate(kj::str(titleCase, "Results"),
                                     kj::heapArray(implicitParams.asPtr()));
      }
    } else {
      resultType = cppFullName(resultSchema, method);
      genericResultType = cppFullName(resultSchema, nullptr);
    }

    kj::String shortParamType = paramProto.getScopeId() == 0 ?
        kj::str(titleCase, "Params") : kj::str(genericParamType);
    kj::String shortResultType = resultProto.getScopeId() == 0 ?
        kj::str(titleCase, "Results") : kj::str(genericResultType);

    auto interfaceProto = method.getContainingInterface().getProto();
    uint64_t interfaceId = interfaceProto.getId();
    auto interfaceIdHex = kj::hex(interfaceId);
    uint16_t methodId = method.getIndex();

    // TODO(msvc):  Notice that the return type of this method's request function is supposed to be
    // `::capnp::Request<param, result>`. If the first template parameter to ::capnp::Request is a
    // template instantiation, MSVC will sometimes complain that it's unspecialized and can't be
    // used as a parameter in the return type (error C3203). It is not clear to me under what exact
    // conditions this bug occurs, but it commonly crops up in test.capnp.h.
    //
    // The easiest (and only) workaround I found is to use C++14's return type deduction here, thus
    // the `CAPNP_AUTO_IF_MSVC()` hackery in the return type declarations below. We're depending on
    // the fact that that this function has an inline implementation for the deduction to work.

    auto requestMethodImpl = kj::strTree(
        templateContext.allDecls(),
        implicitParamsTemplateDecl,
        templateContext.isGeneric() ? "CAPNP_AUTO_IF_MSVC(" : "",
        "::capnp::Request<", paramType, ", ", resultType, ">",
        templateContext.isGeneric() ? ")\n" : "\n",
        interfaceName, "::Client::", name, "Request(::kj::Maybe< ::capnp::MessageSize> sizeHint) {\n"
        "  return newCall<", paramType, ", ", resultType, ">(\n"
        "      0x", interfaceIdHex, "ull, ", methodId, ", sizeHint);\n"
        "}\n");

    return MethodText {
      kj::strTree(
          implicitParamsTemplateDecl.size() == 0 ? "" : "  ", implicitParamsTemplateDecl,
          templateContext.isGeneric() ? "  CAPNP_AUTO_IF_MSVC(" : "  ",
          "::capnp::Request<", paramType, ", ", resultType, ">",
          templateContext.isGeneric() ? ")" : "",
          " ", name, "Request(\n"
          "      ::kj::Maybe< ::capnp::MessageSize> sizeHint = nullptr);\n"),

      kj::strTree(
          paramProto.getScopeId() != 0 ? kj::strTree() : kj::strTree(
              "  typedef ", genericParamType, " ", titleCase, "Params;\n"),
          resultProto.getScopeId() != 0 ? kj::strTree() : kj::strTree(
              "  typedef ", genericResultType, " ", titleCase, "Results;\n"),
          "  typedef ::capnp::CallContext<", shortParamType, ", ", shortResultType, "> ",
                titleCase, "Context;\n"
          "  virtual ::kj::Promise<void> ", identifierName, "(", titleCase, "Context context);\n"),

      implicitParams.size() == 0 ? kj::strTree() : kj::mv(requestMethodImpl),

      kj::strTree(
          implicitParams.size() == 0 ? kj::mv(requestMethodImpl) : kj::strTree(),
          templateContext.allDecls(),
          "::kj::Promise<void> ", interfaceName, "::Server::", identifierName, "(", titleCase, "Context) {\n"
          "  return ::capnp::Capability::Server::internalUnimplemented(\n"
          "      \"", interfaceProto.getDisplayName(), "\", \"", name, "\",\n"
          "      0x", interfaceIdHex, "ull, ", methodId, ");\n"
          "}\n"),

      kj::strTree(
          "    case ", methodId, ":\n"
          "      return ", identifierName, "(::capnp::Capability::Server::internalGetTypedContext<\n"
          "          ", genericParamType, ", ", genericResultType, ">(context));\n")
    };
  }